

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O0

void av1_setup_shared_coeff_buffer
               (SequenceHeader *seq_params,PC_TREE_SHARED_BUFFERS *shared_bufs,
               aom_internal_error_info *error)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  aom_internal_error_info *in_RDX;
  long in_RSI;
  long in_RDI;
  int max_num_pix;
  int i;
  int max_sb_square_uv;
  int max_sb_square_y;
  int num_planes;
  int local_28;
  
  iVar1 = 3;
  if (*(char *)(in_RDI + 0x4d) != '\0') {
    iVar1 = 1;
  }
  iVar2 = 1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"
                [*(byte *)(in_RDI + 0x1c)] & 0x1f);
  for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
    pvVar3 = aom_memalign((size_t)in_RDX,CONCAT44(iVar1,iVar2));
    *(void **)(in_RSI + (long)local_28 * 8) = pvVar3;
    if (*(long *)(in_RSI + (long)local_28 * 8) == 0) {
      aom_internal_error(in_RDX,AOM_CODEC_MEM_ERROR,"Failed to allocate shared_bufs->coeff_buf[i]");
    }
    pvVar3 = aom_memalign((size_t)in_RDX,CONCAT44(iVar1,iVar2));
    *(void **)(in_RSI + 0x18 + (long)local_28 * 8) = pvVar3;
    if (*(long *)(in_RSI + 0x18 + (long)local_28 * 8) == 0) {
      aom_internal_error(in_RDX,AOM_CODEC_MEM_ERROR,"Failed to allocate shared_bufs->qcoeff_buf[i]")
      ;
    }
    pvVar3 = aom_memalign((size_t)in_RDX,CONCAT44(iVar1,iVar2));
    *(void **)(in_RSI + 0x30 + (long)local_28 * 8) = pvVar3;
    if (*(long *)(in_RSI + 0x30 + (long)local_28 * 8) == 0) {
      aom_internal_error(in_RDX,AOM_CODEC_MEM_ERROR,"Failed to allocate shared_bufs->dqcoeff_buf[i]"
                        );
    }
  }
  return;
}

Assistant:

void av1_setup_shared_coeff_buffer(const SequenceHeader *const seq_params,
                                   PC_TREE_SHARED_BUFFERS *shared_bufs,
                                   struct aom_internal_error_info *error) {
  const int num_planes = seq_params->monochrome ? 1 : MAX_MB_PLANE;
  const int max_sb_square_y = 1 << num_pels_log2_lookup[seq_params->sb_size];
  const int max_sb_square_uv = max_sb_square_y >> (seq_params->subsampling_x +
                                                   seq_params->subsampling_y);
  for (int i = 0; i < num_planes; i++) {
    const int max_num_pix =
        (i == AOM_PLANE_Y) ? max_sb_square_y : max_sb_square_uv;
    AOM_CHECK_MEM_ERROR(error, shared_bufs->coeff_buf[i],
                        aom_memalign(32, max_num_pix * sizeof(tran_low_t)));
    AOM_CHECK_MEM_ERROR(error, shared_bufs->qcoeff_buf[i],
                        aom_memalign(32, max_num_pix * sizeof(tran_low_t)));
    AOM_CHECK_MEM_ERROR(error, shared_bufs->dqcoeff_buf[i],
                        aom_memalign(32, max_num_pix * sizeof(tran_low_t)));
  }
}